

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::reallocateTo
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this,size_type newCapacity)

{
  pointer pSVar1;
  long lVar2;
  Base *ctx;
  Base *other;
  pointer this_00;
  
  ctx = (Base *)newCapacity;
  pSVar1 = (pointer)operator_new(newCapacity << 6);
  if (this->len != 0) {
    other = &this->data_->super_SmallVectorBase<int>;
    lVar2 = this->len << 6;
    this_00 = pSVar1;
    do {
      ctx = other;
      SmallVector<int,_10UL>::SmallVector(this_00,other);
      other = other + 2;
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -0x40;
    } while (lVar2 != 0);
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->cap = newCapacity;
  this->data_ = pSVar1;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }